

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::StartArray(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             *this,Context *context)

{
  ValueType *pVVar1;
  Ch *pCVar2;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  context->arrayElementIndex = 0;
  context->inArray = true;
  if ((this->type_ & 8) == 0) {
    pVVar1 = GetArrayString();
    DisallowedType(this,context,pVVar1);
    context->invalidCode = kValidateErrorType;
    pVVar1 = GetValidateErrorKeyword(kValidateErrorType);
    pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar1);
    context->invalidKeyword = pCVar2;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = CreateParallelValidator(this,context);
  }
  return this_local._7_1_;
}

Assistant:

bool StartArray(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::StartArray");
        context.arrayElementIndex = 0;
        context.inArray = true;  // Ensure we note that we are in an array

        if (!(type_ & (1 << kArraySchemaType))) {
            DisallowedType(context, GetArrayString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        return CreateParallelValidator(context);
    }